

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O0

hash_code __thiscall
llvm::hashing::detail::hash_combine_recursive_helper::combine
          (hash_combine_recursive_helper *this,size_t length,char *buffer_ptr,char *buffer_end)

{
  uint64_t uVar1;
  char *buffer_end_local;
  char *buffer_ptr_local;
  size_t length_local;
  hash_combine_recursive_helper *this_local;
  
  if (length == 0) {
    uVar1 = hash_short(this->buffer,(long)buffer_ptr - (long)this,this->seed);
    hash_code::hash_code((hash_code *)&this_local,uVar1);
  }
  else {
    std::_V2::rotate<char*>(this->buffer,buffer_ptr,buffer_end);
    hash_state::mix(&this->state,this->buffer);
    uVar1 = hash_state::finalize(&this->state,(size_t)(buffer_ptr + (length - (long)this)));
    hash_code::hash_code((hash_code *)&this_local,uVar1);
  }
  return (hash_code)(size_t)this_local;
}

Assistant:

hash_code combine(size_t length, char *buffer_ptr, char *buffer_end) {
    // Check whether the entire set of values fit in the buffer. If so, we'll
    // use the optimized short hashing routine and skip state entirely.
    if (length == 0)
      return hash_short(buffer, buffer_ptr - buffer, seed);

    // Mix the final buffer, rotating it if we did a partial fill in order to
    // simulate doing a mix of the last 64-bytes. That is how the algorithm
    // works when we have a contiguous byte sequence, and we want to emulate
    // that here.
    std::rotate(buffer, buffer_ptr, buffer_end);

    // Mix this chunk into the current state.
    state.mix(buffer);
    length += buffer_ptr - buffer;

    return state.finalize(length);
  }